

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O0

char * __thiscall crypto::xchacha20::crypt(xchacha20 *this,char *__key,char *__salt)

{
  char *in_RCX;
  uint8_t key;
  size_t i;
  undefined7 in_stack_ffffffffffffffd0;
  byte in_stack_ffffffffffffffd7;
  char *local_28;
  
  local_28 = (char *)0x0;
  while (local_28 < in_RCX) {
    if (this->pos == '@') {
      update((xchacha20 *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      this->pos = '\0';
    }
    in_stack_ffffffffffffffd7 = (byte)(this->keystream[this->pos >> 2] >> ((this->pos & 3) << 3));
    __salt[(long)local_28] = __key[(long)local_28] ^ in_stack_ffffffffffffffd7;
    local_28 = local_28 + 1;
    this->pos = this->pos + '\x01';
  }
  return local_28;
}

Assistant:

void xchacha20::crypt(const char * in, char * out, size_t length) {
	
	// asume pos > 0 && pos <= 64
	
	for(size_t i = 0; i < length; i++, pos++) {
		if(pos == sizeof(keystream)) {
			update();
			pos = 0;
		}
		boost::uint8_t key = boost::uint8_t(keystream[pos / sizeof(word)] >> ((pos % sizeof(word)) * 8));
		out[i] = char(boost::uint8_t(in[i]) ^ key);
	}
	
}